

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenSymbolExpression
          (string *__return_storage_ptr__,TsGenerator *this,EnumDef *enum_def,bool has_name_clash,
          string *import_name,string *name,string *param_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_39;
  string *local_38;
  string *name_local;
  string *import_name_local;
  EnumDef *pEStack_20;
  bool has_name_clash_local;
  EnumDef *enum_def_local;
  TsGenerator *this_local;
  string *symbols_expression;
  
  local_39 = 0;
  local_38 = name;
  name_local = import_name;
  import_name_local._7_1_ = has_name_clash;
  pEStack_20 = enum_def;
  enum_def_local = (EnumDef *)this;
  this_local = (TsGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if ((import_name_local._7_1_ & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_38);
  }
  else {
    std::operator+(&local_80,name_local," as ");
    std::operator+(&local_60,&local_80,local_38);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  if ((pEStack_20->is_union & 1U) != 0) {
    std::operator+(&local_f0,"unionTo",local_38);
    Namer::Function(&local_d0,&(this->namer_).super_Namer,&local_f0);
    std::operator+(&local_b0,", ",&local_d0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::operator+(&local_150,"unionListTo",local_38);
    Namer::Function(&local_130,&(this->namer_).super_Namer,&local_150);
    std::operator+(&local_110,", ",&local_130);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenSymbolExpression(const EnumDef &enum_def,
                                  const bool has_name_clash,
                                  const std::string &import_name,
                                  const std::string &name,
                                  const std::string &) {
    std::string symbols_expression;
    if (has_name_clash) {
      symbols_expression += import_name + " as " + name;
    } else {
      symbols_expression += name;
    }

    if (enum_def.is_union) {
      symbols_expression += (", " + namer_.Function("unionTo" + name));
      symbols_expression += (", " + namer_.Function("unionListTo" + name));
    }

    return symbols_expression;
  }